

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedBitDecoder.cpp
# Opt level: O0

string * ZXing::OneD::DataBar::DecodeExpandedBits_abi_cxx11_(BitArray *_bits)

{
  int iVar1;
  BitArrayView *in_RSI;
  string *in_RDI;
  BitArrayView *unaff_retaddr;
  BitArrayView *in_stack_00000008;
  BitArrayView *in_stack_00000018;
  BitArrayView bits;
  BitArrayView *in_stack_00000058;
  char in_stack_00000077;
  BitArrayView *in_stack_00000078;
  char *in_stack_00000098;
  char *in_stack_000000a0;
  BitArrayView *in_stack_000000a8;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  BitArrayView *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffec;
  string *psVar2;
  int n;
  
  psVar2 = in_RDI;
  BitArrayView::BitArrayView
            (in_stack_ffffffffffffffc0,
             (BitArray *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  n = (int)((ulong)psVar2 >> 0x20);
  BitArrayView::readBits(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  iVar1 = BitArrayView::peakBits(unaff_retaddr,n);
  if (iVar1 == 1) {
    BitArrayView::skipBits(in_RSI,in_stack_ffffffffffffffec);
    DecodeAI01AndOtherAIs_abi_cxx11_(in_stack_00000058);
  }
  else {
    iVar1 = BitArrayView::peakBits(unaff_retaddr,n);
    if (iVar1 == 0) {
      BitArrayView::skipBits(in_RSI,in_stack_ffffffffffffffec);
      DecodeAnyAI_abi_cxx11_
                ((BitArrayView *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    else {
      iVar1 = BitArrayView::peakBits(unaff_retaddr,n);
      if (iVar1 == 4) {
        BitArrayView::skipBits(in_RSI,in_stack_ffffffffffffffec);
        DecodeAI013103_abi_cxx11_(in_stack_00000008);
      }
      else if (iVar1 == 5) {
        BitArrayView::skipBits(in_RSI,in_stack_ffffffffffffffec);
        DecodeAI01320x_abi_cxx11_(in_stack_00000018);
      }
      else {
        iVar1 = BitArrayView::peakBits(unaff_retaddr,n);
        if (iVar1 == 0xc) {
          BitArrayView::skipBits(in_RSI,in_stack_ffffffffffffffec);
          DecodeAI0139yx_abi_cxx11_(in_stack_00000078,in_stack_00000077);
        }
        else if (iVar1 == 0xd) {
          BitArrayView::skipBits(in_RSI,in_stack_ffffffffffffffec);
          DecodeAI0139yx_abi_cxx11_(in_stack_00000078,in_stack_00000077);
        }
        else {
          iVar1 = BitArrayView::readBits(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
          switch(iVar1) {
          case 0x38:
            DecodeAI013x0x1x_abi_cxx11_(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
            break;
          case 0x39:
            DecodeAI013x0x1x_abi_cxx11_(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
            break;
          case 0x3a:
            DecodeAI013x0x1x_abi_cxx11_(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
            break;
          case 0x3b:
            DecodeAI013x0x1x_abi_cxx11_(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
            break;
          case 0x3c:
            DecodeAI013x0x1x_abi_cxx11_(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
            break;
          case 0x3d:
            DecodeAI013x0x1x_abi_cxx11_(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
            break;
          case 0x3e:
            DecodeAI013x0x1x_abi_cxx11_(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
            break;
          case 0x3f:
            DecodeAI013x0x1x_abi_cxx11_(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
            break;
          default:
            std::__cxx11::string::string((string *)in_RDI);
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

std::string DecodeExpandedBits(const BitArray& _bits)
{
	auto bits = BitArrayView(_bits);
	bits.readBits(1); // skip linkage bit

	if (bits.peakBits(1) == 1)
		return DecodeAI01AndOtherAIs(bits.skipBits(1));

	if (bits.peakBits(2) == 0)
		return DecodeAnyAI(bits.skipBits(2));

	switch (bits.peakBits(4)) {
	case 4: return DecodeAI013103(bits.skipBits(4));
	case 5: return DecodeAI01320x(bits.skipBits(4));
	}

	switch (bits.peakBits(5)) {
	case 12: return DecodeAI0139yx(bits.skipBits(5), '2');
	case 13: return DecodeAI0139yx(bits.skipBits(5), '3');
	}

	switch (bits.readBits(7)) {
	case 56: return DecodeAI013x0x1x(bits, "310", "11");
	case 57: return DecodeAI013x0x1x(bits, "320", "11");
	case 58: return DecodeAI013x0x1x(bits, "310", "13");
	case 59: return DecodeAI013x0x1x(bits, "320", "13");
	case 60: return DecodeAI013x0x1x(bits, "310", "15");
	case 61: return DecodeAI013x0x1x(bits, "320", "15");
	case 62: return DecodeAI013x0x1x(bits, "310", "17");
	case 63: return DecodeAI013x0x1x(bits, "320", "17");
	}

	return {};
}